

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

int getIndentation(QString *text)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (text->d).size;
  lVar2 = 0;
  if (lVar1 < 1) {
    lVar1 = lVar2;
  }
  while( true ) {
    if (lVar2 == 4) {
      return 4;
    }
    if (lVar1 == lVar2) break;
    if ((text->d).ptr[lVar2] != L' ') {
      return (int)lVar2;
    }
    lVar2 = lVar2 + 1;
  }
  return (int)lVar1;
}

Assistant:

int getIndentation(const QString &text) {
    int spaces = 0;
    // no more than 3 spaces
    while (spaces < 4 && spaces < text.length() &&
           text.at(spaces) == QLatin1Char(' '))
        ++spaces;
    return spaces;
}